

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_gb16(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = in->a;
  if ((int)uVar2 < 1) {
    uVar2 = back->ig;
  }
  else {
    if (uVar2 < 0xffff) {
      bVar1 = sRGB((1.0 - (double)(int)uVar2 / 65535.0) * back->dg +
                   (double)in->g * (((double)(int)uVar2 / 65535.0) / 65535.0));
    }
    else {
      bVar1 = isRGB(in->g);
    }
    uVar2 = (uint)bVar1;
  }
  out->b = uVar2;
  out->g = uVar2;
  out->r = uVar2;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_gb16(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
      out->r = out->g = out->b = back->ig;

   else if (in->a >= 65535)
      out->r = out->g = out->b = isRGB(in->g);

   else
   {
      double a = in->a / 65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = out->g = out->b = sRGB(in->g * a + back->dg * a1);
   }

   out->a = 255;
}